

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_diff.c
# Opt level: O0

int str_diff(char *s,char *t)

{
  byte *pbVar1;
  byte local_19;
  byte *pbStack_18;
  char x;
  char *t_local;
  char *s_local;
  
  pbStack_18 = (byte *)t;
  for (t_local = s;
      (local_19 = *t_local, pbVar1 = pbStack_18, local_19 == *pbStack_18 && (local_19 != 0));
      t_local = t_local + 4) {
    pbVar1 = pbStack_18 + 1;
    local_19 = t_local[1];
    if ((local_19 != *pbVar1) || (local_19 == 0)) break;
    pbVar1 = pbStack_18 + 2;
    local_19 = t_local[2];
    if ((local_19 != *pbVar1) || (local_19 == 0)) break;
    pbVar1 = pbStack_18 + 3;
    local_19 = t_local[3];
    if ((local_19 != *pbVar1) || (local_19 == 0)) break;
    pbStack_18 = pbStack_18 + 4;
  }
  pbStack_18 = pbVar1;
  return (uint)local_19 - (uint)*pbStack_18;
}

Assistant:

int str_diff(register const char *s,register const char *t)
{
  register char x;

  for (;;) {
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
  }
  return ((int)(unsigned int)(unsigned char) x)
       - ((int)(unsigned int)(unsigned char) *t);
}